

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::NegativeGLSLCompileTimeErrors::Run(NegativeGLSLCompileTimeErrors *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  long lVar2;
  int in_R8D;
  GLint x;
  string local_50;
  GLint z;
  GLint y;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "#version 420 core\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
             ,(allocator<char> *)&x);
  bVar1 = Compile(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  lVar2 = -1;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(local_size_x = 2) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
               ,(allocator<char> *)&x);
    bVar1 = Compile(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "#version 430 core\nlayout(local_size_x = 1) in;\nin uint x;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = x;\n}"
                 ,(allocator<char> *)&x);
      bVar1 = Compile(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "#version 430 core\nlayout(local_size_x = 1) in;\nout uint x;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n  x = 0;\n}"
                   ,(allocator<char> *)&x);
        bVar1 = Compile(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) {
          this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper;
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&x);
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&y);
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&z);
          gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                    (&local_50,(NegativeGLSLCompileTimeErrors *)(ulong)(x + 1),1,1,in_R8D);
          bVar1 = Compile(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                      (&local_50,(NegativeGLSLCompileTimeErrors *)&DAT_00000001,y + 1,1,in_R8D);
            bVar1 = Compile(this,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar1) {
              gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                        (&local_50,(NegativeGLSLCompileTimeErrors *)&DAT_00000001,1,z + 1,in_R8D);
              bVar1 = Compile(this,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              if (bVar1) {
                lVar2 = 0;
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		// gl_GlobalInvocationID requires "#version 430" or later or GL_ARB_compute_shader
		// extension enabled
		if (!Compile("#version 420 core" NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL
					 "  uint g_output[];" NL "};" NL "void main() {" NL "  g_output[gl_GlobalInvocationID.x] = 0;" NL
					 "}"))
			return ERROR;

		if (!Compile("#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(local_size_x = 2) in;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = 0;" NL "}"))
			return ERROR;

		if (!Compile("#version 430 core" NL "layout(local_size_x = 1) in;" NL "in uint x;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = x;" NL "}"))
			return ERROR;

		if (!Compile("#version 430 core" NL "layout(local_size_x = 1) in;" NL "out uint x;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = 0;" NL "  x = 0;" NL "}"))
			return ERROR;

		{
			GLint x, y, z;
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &x);
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &y);
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &z);

			if (!Compile(Shader1(x + 1, 1, 1)))
				return ERROR;
			if (!Compile(Shader1(1, y + 1, 1)))
				return ERROR;
			if (!Compile(Shader1(1, 1, z + 1)))
				return ERROR;
		}

		return NO_ERROR;
	}